

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_color.cxx
# Opt level: O3

Fl_Color fl_contrast(Fl_Color fg,Fl_Color bg)

{
  uint uVar1;
  Fl_Color FVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = fg;
  if (fg < 0x100) {
    uVar1 = fl_cmap[fg];
  }
  if (bg < 0x100) {
    bg = fl_cmap[bg];
  }
  uVar1 = ((uVar1 >> 8 & 0xff) * 0xb + (uVar1 >> 0x18) * 0x1e + (uVar1 >> 0x10 & 0xff) * 0x3b) / 100
  ;
  uVar4 = (bg >> 8 & 0xff) * 0xb + (bg >> 0x18) * 0x1e + (bg >> 0x10 & 0xff) * 0x3b;
  uVar3 = uVar4 / 100;
  FVar2 = 0x38;
  if (uVar4 < 0x3200) {
    FVar2 = 0xff;
  }
  if (99 < (int)(uVar3 - uVar1)) {
    FVar2 = fg;
  }
  if (99 < (int)(uVar1 - uVar3)) {
    FVar2 = fg;
  }
  return FVar2;
}

Assistant:

Fl_Color fl_contrast(Fl_Color fg, Fl_Color bg) {
  unsigned c1, c2;	// RGB colors
  int l1, l2;		// Luminosities


  // Get the RGB values for each color...
  if (fg & 0xffffff00) c1 = (unsigned)fg;
  else c1 = fl_cmap[fg];

  if (bg & 0xffffff00) c2 = (unsigned)bg;
  else c2 = fl_cmap[bg];

  // Compute the luminosity...
  l1 = ((c1 >> 24) * 30 + ((c1 >> 16) & 255) * 59 + ((c1 >> 8) & 255) * 11) / 100;
  l2 = ((c2 >> 24) * 30 + ((c2 >> 16) & 255) * 59 + ((c2 >> 8) & 255) * 11) / 100;

  // Compare and return the contrasting color...
  if ((l1 - l2) > 99) return fg;
  else if ((l2 - l1) > 99) return fg;
  else if (l2 > 127) return FL_BLACK;
  else return FL_WHITE;
}